

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuBackend.cpp
# Opt level: O2

char * xmrig::backend_tag(uint32_t backend)

{
  if (backend == 2) {
    return "\x1b[42;1m\x1b[1;37m nv  \x1b[0m";
  }
  if (backend != 1) {
    return "\x1b[46;1m\x1b[1;37m cpu \x1b[0m";
  }
  return "\x1b[45;1m\x1b[1;37m ocl \x1b[0m";
}

Assistant:

const char *xmrig::backend_tag(uint32_t backend)
{
#   ifdef XMRIG_FEATURE_OPENCL
    if (backend == Nonce::OPENCL) {
        return ocl_tag();
    }
#   endif

#   ifdef XMRIG_FEATURE_CUDA
    if (backend == Nonce::CUDA) {
        return cuda_tag();
    }
#   endif

    return tag;
}